

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O2

void merge_3way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
                        uchar **result)

{
  long lVar1;
  uchar *puVar2;
  size_t sVar3;
  uchar **ppuVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  uchar **ppuVar9;
  long lVar10;
  size_t __n;
  size_t sVar11;
  uchar **local_50;
  uchar **local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = from1;
  local_38 = n2;
  local_40 = n1;
  ppuVar9 = from2;
LAB_001c19f5:
  while( true ) {
    local_50 = ppuVar9;
    iVar6 = cmp(*from0,*local_48);
    iVar7 = cmp(*local_48,*local_50);
    if (-1 < iVar6) break;
    if (iVar7 < 0) {
      lVar10 = 0;
LAB_001c1ac4:
      (*(code *)((long)&DAT_001eab5c + (long)(int)(&DAT_001eab5c)[lVar10]))();
      return;
    }
    if (iVar7 == 0) {
LAB_001c2002:
      lVar10 = 0;
      do {
        *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)from0 + lVar10);
        if (n0 == 1) {
          result = (uchar **)((long)result + lVar10 + 8);
          local_40 = local_40;
          goto LAB_001c227f;
        }
        iVar6 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_48);
        cVar5 = (iVar6 != 0) * '\x03' + '\t';
        if (iVar6 < 0) {
          cVar5 = '\x04';
        }
        lVar10 = lVar10 + 8;
        n0 = n0 - 1;
      } while (cVar5 == '\x04');
      result = (uchar **)((long)result + lVar10);
      from0 = (uchar **)((long)from0 + lVar10);
      if (cVar5 == '\t') goto LAB_001c20fc;
LAB_001c2215:
      *result = *local_48;
      puVar2 = *local_50;
      local_50 = local_50 + 1;
      result[1] = puVar2;
      result = result + 2;
      local_38 = local_38 - 1;
      local_40 = local_40 - 1;
      if (local_40 == 0) {
LAB_001c2306:
        local_40 = local_38;
        ppuVar9 = local_50;
        ppuVar4 = from0;
        sVar11 = local_38;
        if (n0 == 0) goto joined_r0x001c234d;
        goto joined_r0x001c2318;
      }
      local_48 = local_48 + 1;
      sVar11 = local_40;
      ppuVar9 = local_50;
      if (local_38 == 0) {
LAB_001c22d6:
        ppuVar4 = from0;
        local_50 = local_48;
        if (n0 == 0) {
          if (sVar11 == 0) {
            return;
          }
LAB_001c22f0:
          __n = sVar11 << 3;
        }
        else {
joined_r0x001c2318:
          local_40 = sVar11;
          local_48 = ppuVar4;
          from0 = local_48;
          if (local_40 != 0) {
LAB_001c2328:
            merge_2way_unstable(from0,n0,local_50,local_40,result);
            return;
          }
          __n = n0 << 3;
        }
LAB_001c2359:
        memcpy(result,local_48,__n);
        return;
      }
    }
    else {
      iVar6 = cmp(*from0,*local_50);
      lVar10 = 1;
      if (iVar6 < 0) goto LAB_001c1ac4;
      if (iVar6 != 0) goto LAB_001c1c99;
LAB_001c217e:
      *result = *from0;
      puVar2 = *local_50;
      local_50 = local_50 + 1;
      result[1] = puVar2;
      result = result + 2;
      local_38 = local_38 - 1;
      n0 = n0 - 1;
      local_40 = local_40;
      sVar11 = local_40;
      ppuVar9 = local_50;
      ppuVar4 = local_48;
      sVar3 = local_38;
      if (n0 == 0) goto LAB_001c227f;
joined_r0x001c1e8f:
      local_50 = ppuVar4;
      from0 = from0 + 1;
      ppuVar4 = from0;
      if (sVar3 == 0) goto joined_r0x001c2318;
    }
  }
  if (iVar6 == 0) {
    if (-1 < iVar7) {
      if (iVar7 != 0) {
LAB_001c1df7:
        lVar10 = 0;
        do {
          *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)local_50 + lVar10);
          if (local_38 == 1) {
            result = (uchar **)((long)result + lVar10 + 8);
            sVar11 = local_40;
            goto LAB_001c22d6;
          }
          iVar6 = cmp(*(void **)((long)local_50 + lVar10 + 8),*from0);
          bVar8 = iVar6 == 0 | 8;
          if (iVar6 < 0) {
            bVar8 = 10;
          }
          lVar10 = lVar10 + 8;
          local_38 = local_38 - 1;
        } while (bVar8 == 10);
        result = (uchar **)((long)result + lVar10);
        local_50 = (uchar **)((long)local_50 + lVar10);
        if (bVar8 == 8) goto LAB_001c1e66;
      }
      goto LAB_001c20fc;
    }
LAB_001c1e66:
    *result = *from0;
    puVar2 = *local_48;
    local_48 = local_48 + 1;
    result[1] = puVar2;
    result = result + 2;
    local_40 = local_40 - 1;
    n0 = n0 - 1;
    sVar11 = local_38;
    ppuVar9 = local_50;
    ppuVar4 = local_50;
    sVar3 = local_40;
    if (n0 != 0) goto joined_r0x001c1e8f;
  }
  else {
    lVar10 = 4;
    if (0 < iVar7) goto LAB_001c1ac4;
    if (iVar7 == 0) goto LAB_001c2215;
    iVar6 = cmp(*from0,*local_50);
    if (iVar6 < 0) {
LAB_001c1f57:
      do {
        lVar10 = 0;
LAB_001c1f66:
        local_40 = local_40 - 1;
        *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)local_48 + lVar10);
        if (local_40 == 0) goto LAB_001c2266;
        iVar6 = cmp(*(void **)((long)local_48 + lVar10 + 8),*from0);
        bVar8 = 0xd;
        if (iVar6 < 0) goto LAB_001c1fc1;
        if (iVar6 == 0) {
          result = (uchar **)((long)result + lVar10 + 8);
          local_48 = (uchar **)((long)local_48 + lVar10 + 8);
          goto LAB_001c1e66;
        }
        iVar6 = cmp(*(void **)((long)local_48 + lVar10 + 8),*local_50);
        if (-1 < iVar6) {
          bVar8 = iVar6 == 0 ^ 5;
          goto LAB_001c1fc1;
        }
        result = (uchar **)((long)result + lVar10 + 8);
        local_48 = (uchar **)((long)local_48 + lVar10 + 8);
LAB_001c1afd:
        lVar10 = 0;
LAB_001c1b05:
        n0 = n0 - 1;
        *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)from0 + lVar10);
        if (n0 == 0) {
LAB_001c2252:
          result = (uchar **)((long)result + lVar10 + 8);
          local_40 = local_40;
          goto LAB_001c227f;
        }
        iVar6 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_48);
        bVar8 = 3;
        if (iVar6 < 0) {
LAB_001c1b52:
          lVar10 = lVar10 + 8;
          if (bVar8 != 3) {
            result = (uchar **)((long)result + lVar10);
            from0 = (uchar **)((long)from0 + lVar10);
            if (bVar8 != 0xe) goto LAB_001c1bad;
            goto LAB_001c2088;
          }
          goto LAB_001c1b05;
        }
        if (iVar6 == 0) {
          result = (uchar **)((long)result + lVar10 + 8);
          from0 = (uchar **)((long)from0 + lVar10 + 8);
          goto LAB_001c1e66;
        }
        iVar6 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_50);
        if (-1 < iVar6) {
          bVar8 = iVar6 == 0 ^ 0xf;
          goto LAB_001c1b52;
        }
        result = (uchar **)((long)result + lVar10 + 8);
        from0 = (uchar **)((long)from0 + lVar10 + 8);
      } while( true );
    }
    lVar10 = 6;
    if (iVar6 != 0) goto LAB_001c1ac4;
LAB_001c2088:
    lVar10 = 0;
    do {
      *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)local_48 + lVar10);
      if (local_40 == 1) {
        result = (uchar **)((long)result + lVar10 + 8);
        goto LAB_001c2306;
      }
      iVar6 = cmp(*(void **)((long)local_48 + lVar10 + 8),*from0);
      cVar5 = (iVar6 == 0) * '\x03' + '\x06';
      if (iVar6 < 0) {
        cVar5 = '\x0e';
      }
      lVar10 = lVar10 + 8;
      local_40 = local_40 - 1;
    } while (cVar5 == '\x0e');
    if (cVar5 == '\x06') {
      result = (uchar **)((long)result + lVar10);
      local_48 = (uchar **)((long)local_48 + lVar10);
      goto LAB_001c217e;
    }
    result = (uchar **)((long)result + lVar10);
    local_48 = (uchar **)((long)local_48 + lVar10);
LAB_001c20fc:
    *result = *from0;
    puVar2 = *local_48;
    local_48 = local_48 + 1;
    result[1] = puVar2;
    ppuVar9 = local_50 + 1;
    result[2] = *local_50;
    result = result + 3;
    local_40 = local_40 - 1;
    local_38 = local_38 - 1;
    n0 = n0 - 1;
    local_50 = ppuVar9;
    if (n0 != 0) {
      from0 = from0 + 1;
      ppuVar4 = from0;
      sVar11 = local_38;
      if (local_40 == 0) goto joined_r0x001c2318;
      local_50 = local_48;
      if (local_38 == 0) goto LAB_001c2328;
      goto LAB_001c19f5;
    }
  }
LAB_001c227f:
  n0 = local_40;
  local_40 = local_38;
  ppuVar9 = local_50;
  if (n0 != 0) {
    from0 = local_48;
    sVar11 = n0;
    if (local_40 != 0) goto LAB_001c2328;
    goto LAB_001c22f0;
  }
joined_r0x001c234d:
  local_48 = ppuVar9;
  if (local_40 == 0) {
    return;
  }
  __n = local_40 << 3;
  goto LAB_001c2359;
LAB_001c1fc1:
  lVar10 = lVar10 + 8;
  if (bVar8 != 0xd) goto code_r0x001c1fcf;
  goto LAB_001c1f66;
code_r0x001c1fcf:
  if (bVar8 == 5) {
    result = (uchar **)((long)result + lVar10);
    local_48 = (uchar **)((long)local_48 + lVar10);
LAB_001c1d6c:
    lVar10 = 0;
    do {
      n0 = n0 - 1;
      *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)from0 + lVar10);
      if (n0 == 0) goto LAB_001c2252;
      iVar6 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_50);
      bVar8 = 5;
      if (-1 < iVar6) {
        if (iVar6 == 0) {
          result = (uchar **)((long)result + lVar10 + 8);
          from0 = (uchar **)((long)from0 + lVar10 + 8);
          goto LAB_001c217e;
        }
        iVar6 = cmp(*(void **)((long)from0 + lVar10 + 8),*local_48);
        if (iVar6 < 0) goto LAB_001c21c1;
        bVar8 = iVar6 == 0 ^ 0xb;
      }
      lVar10 = lVar10 + 8;
      if (bVar8 != 5) {
        result = (uchar **)((long)result + lVar10);
        from0 = (uchar **)((long)from0 + lVar10);
        if (bVar8 != 10) goto LAB_001c1eb1;
        goto LAB_001c1df7;
      }
    } while( true );
  }
  result = (uchar **)((long)result + lVar10);
  local_48 = (uchar **)((long)local_48 + lVar10);
  goto LAB_001c2002;
LAB_001c21c1:
  result = (uchar **)((long)result + lVar10 + 8);
  from0 = (uchar **)((long)from0 + lVar10 + 8);
LAB_001c1c99:
  lVar10 = 0;
  do {
    local_38 = local_38 - 1;
    *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)local_50 + lVar10);
    if (local_38 == 0) {
      lVar10 = (long)result + lVar10;
      goto LAB_001c22cc;
    }
    iVar7 = cmp(*(void **)((long)local_50 + lVar10 + 8),*from0);
    iVar6 = 7;
    if (-1 < iVar7) {
      if (iVar7 == 0) {
        result = (uchar **)((long)result + lVar10 + 8);
        local_50 = (uchar **)((long)local_50 + lVar10 + 8);
        goto LAB_001c217e;
      }
      iVar7 = cmp(*(void **)((long)local_50 + lVar10 + 8),*local_48);
      iVar6 = 3;
      if (iVar7 == 0) {
        iVar6 = 0x16;
      }
      if (iVar7 < 0) break;
    }
    lVar10 = lVar10 + 8;
    if (iVar6 != 7) {
      result = (uchar **)((long)result + lVar10);
      if (iVar6 != 3) {
        local_50 = (uchar **)((long)local_50 + lVar10);
        goto LAB_001c2002;
      }
      local_50 = (uchar **)((long)local_50 + lVar10);
      goto LAB_001c1afd;
    }
  } while( true );
  result = (uchar **)((long)result + lVar10 + 8);
  local_50 = (uchar **)((long)local_50 + lVar10 + 8);
  goto LAB_001c1d6c;
LAB_001c1eb1:
  lVar1 = 0;
  do {
    lVar10 = lVar1;
    local_38 = local_38 - 1;
    *(undefined8 *)((long)result + lVar10) = *(undefined8 *)((long)local_50 + lVar10);
    if (local_38 == 0) {
      lVar10 = (long)result + lVar10;
LAB_001c22cc:
      result = (uchar **)(lVar10 + 8);
      sVar11 = local_40;
      goto LAB_001c22d6;
    }
    iVar7 = cmp(*(void **)((long)local_50 + lVar10 + 8),*local_48);
    iVar6 = 0xb;
    if (iVar7 < 0) goto LAB_001c1f15;
    if (iVar7 == 0) {
      result = (uchar **)((long)result + lVar10 + 8);
      local_50 = (uchar **)((long)local_50 + lVar10 + 8);
      goto LAB_001c2215;
    }
    iVar7 = cmp(*(void **)((long)local_50 + lVar10 + 8),*from0);
    iVar6 = 0xd;
    if (iVar7 == 0) {
      iVar6 = 0x18;
    }
    if (iVar7 < 0) goto LAB_001c1f2c;
LAB_001c1f15:
    lVar1 = lVar10 + 8;
  } while (iVar6 == 0xb);
  if (iVar6 == 0xd) goto LAB_001c1f49;
  if (iVar6 != 0xf) {
    result = (uchar **)((long)result + lVar1);
    local_50 = (uchar **)((long)local_50 + lVar1);
    goto LAB_001c2088;
  }
LAB_001c1f2c:
  result = (uchar **)((long)result + lVar10 + 8);
  local_50 = (uchar **)((long)local_50 + lVar10 + 8);
LAB_001c1bad:
  local_40 = local_40 - 1;
  lVar10 = 0;
  *result = *local_48;
  if (local_40 == 0) goto LAB_001c2266;
  iVar7 = cmp(local_48[1],*local_50);
  iVar6 = 0xf;
  if (iVar7 < 0) {
LAB_001c1c16:
    (*(code *)((long)&DAT_001eab78 + (long)(int)(&DAT_001eab78)[iVar6 - 7U >> 2]))();
    return;
  }
  if (iVar7 == 0) {
    result = result + 1;
    local_48 = local_48 + 1;
    goto LAB_001c2215;
  }
  iVar7 = cmp(local_48[1],*from0);
  iVar6 = 0x13;
  if (iVar7 != 0) {
    iVar6 = 7;
  }
  if (-1 < iVar7) goto LAB_001c1c16;
  result = result + 1;
  local_48 = local_48 + 1;
  goto LAB_001c1eb1;
LAB_001c1f49:
  result = (uchar **)((long)result + lVar1);
  local_50 = (uchar **)((long)local_50 + lVar1);
  goto LAB_001c1f57;
LAB_001c2266:
  result = (uchar **)((long)result + lVar10 + 8);
  goto LAB_001c2306;
}

Assistant:

static void
merge_3way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict from2, size_t n2,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";

initial:
{
	const int cmp01 = cmp(*from0, *from1);
	const int cmp12 = cmp(*from1, *from2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(*from0, *from2);
		if (cmp02 < 0)  { goto state0lt2lt1; }
		if (cmp02 == 0) { goto state0eq2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0eq1lt2; }
		if (cmp12 == 0) { goto all_eq;       }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1eq2lt0; }
	cmp02 = cmp(*from0, *from2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;
}

#define StrictCase(a,b,c)                                                      \
	state##a##lt##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
		if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
		int cmpac = cmp(*from##a, *from##c);                           \
		if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
		if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
		goto state##b##lt##c##lt##a;                                   \
	}
	StrictCase(0, 1, 2)
	StrictCase(0, 2, 1)
	StrictCase(1, 0, 2)
	StrictCase(1, 2, 0)
	StrictCase(2, 0, 1)
	StrictCase(2, 1, 0)
#undef StrictCase

#define EqLt(a,b,c)                                                            \
	static_assert(a < b, "a < b");                                         \
	state##a##eq##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from ##a ++;                                      \
		*result++ = *from ##b ++;                                      \
		--n##a;                                                        \
		--n##b;                                                        \
		if (n##a == 0) goto finish ##a;                                \
		if (n##b == 0) goto finish ##b;                                \
		goto initial;                                                  \
	}
	EqLt(0, 1, 2)
	EqLt(0, 2, 1)
	EqLt(1, 2, 0)
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;
#undef EqLt

#define LtEq(a,b,c)                                                            \
	static_assert(b < c, "b < c");                                         \
	state##a##lt##b##eq##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##eq##c;                   \
		if (cmpab == 0) goto all_eq;                                   \
		goto state##b##eq##c##lt## a;                                  \
	}
	LtEq(0, 1, 2)
	LtEq(1, 0, 2)
	LtEq(2, 0, 1)
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;
#undef LtEq

all_eq:
{
	*result++ = *from0++;
	*result++ = *from1++;
	*result++ = *from2++;
	--n0;
	--n1;
	--n2;
	if (n0==0) goto finish0;
	if (n1==0) goto finish1;
	if (n2==0) goto finish2;
	goto initial;
}

finish0:
	assert(n0 == 0);
	if (n1) {
		if (n2) {
			merge_2way_unstable(from1, n1, from2, n2, result);
		} else {
			(void) memcpy(result, from1, n1*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1 == 0);
	if (n0) {
		if (n2) {
			merge_2way_unstable(from0, n0, from2, n2, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish2:
	assert(n2 == 0);
	if (n0) {
		if (n1) {
			merge_2way_unstable(from0, n0, from1, n1, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n1) {
		(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
}